

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O3

int Potassco::xconvert<Clasp::Cli::ConfigKey,unsigned_int>
              (char *x,pair<Clasp::Cli::ConfigKey,_unsigned_int> *out,char **errPos,int sep)

{
  char cVar1;
  int iVar2;
  KV *pKVar3;
  bool bVar4;
  char *n;
  pair<Clasp::Cli::ConfigKey,_unsigned_int> temp;
  char *local_48;
  pair<Clasp::Cli::ConfigKey,_unsigned_int> local_40;
  ulong local_38;
  
  if (x == (char *)0x0) {
    return 0;
  }
  iVar2 = 0x2c;
  if (sep != 0) {
    iVar2 = sep;
  }
  local_40 = *out;
  cVar1 = *x;
  local_48 = x;
  if (cVar1 == '(') {
    local_48 = x + 1;
  }
  local_38 = (ulong)(cVar1 == '(');
  pKVar3 = findValue((Potassco *)Clasp::Cli::enumMap(Clasp::Cli::ConfigKey_const*)::map,
                     (Span<Potassco::KV> *)&DAT_00000008,local_48,&local_48,",");
  bVar4 = true;
  if (pKVar3 != (KV *)0x0) {
    local_40.first = pKVar3->value;
    if (((char)iVar2 == *local_48) && (local_48[1] != '\0')) {
      iVar2 = xconvert(local_48 + 1,&local_40.second,&local_48,iVar2);
      bVar4 = iVar2 == 0;
    }
  }
  if ((cVar1 == '(') && (*local_48 != ')')) {
LAB_0012ba6e:
    iVar2 = 0;
    local_48 = x;
  }
  else {
    local_48 = local_48 + local_38;
    if (bVar4) {
      if (*local_48 != '\0') goto LAB_0012ba6e;
      iVar2 = 1;
    }
    else {
      out->second = local_40.second;
      iVar2 = 2;
    }
    out->first = local_40.first;
  }
  if (errPos != (char **)0x0) {
    *errPos = local_48;
  }
  return iVar2;
}

Assistant:

int xconvert(const char* x, std::pair<T, U>& out, const char** errPos = 0, int sep = def_sep) {
	if (!x) { return 0; }
	if (sep == 0) { sep = def_sep; }
	std::pair<T, U> temp(out);
	const char* n = x;
	int ps = 0;
	if (*n == '(') { ++ps; ++n; }
	int tokT = xconvert(n, temp.first, &n, sep);
	int tokU = tokT && *n == (char)sep && n[1] ? xconvert(n+1, temp.second, &n, sep) : 0;
	int sum  = 0;
	if (!ps || *n == ')') {
		n += ps;
		if (tokU)        { out.second= temp.second; ++sum; }
		if (tokU || !*n) { out.first = temp.first; ++sum; }
	}
	if (!sum) { n = x; }
	if (errPos) *errPos = n;
	return sum;
}